

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O2

int cmp_greediness(Parser *p,PNode *x,PNode *y)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  PNode *pPVar4;
  PNode *pPVar5;
  char *pcVar6;
  char *pcVar7;
  int iVar8;
  PNode **__ptr;
  ulong uVar9;
  uint uVar10;
  VecPNode local_60;
  VecPNode pvx;
  
  pvx.n = 0;
  pvx.v = (PNode **)0x0;
  local_60.n = 0;
  local_60.v = (PNode **)0x0;
  get_unshared_pnodes(p,x,y,&pvx,&local_60);
  if (pvx.v != (PNode **)0x0) {
    qsort(pvx.v,(ulong)pvx.n,8,greedycmp);
  }
  uVar10 = 0;
  if (local_60.v == (PNode **)0x0) {
    __ptr = (PNode **)0x0;
  }
  else {
    qsort(local_60.v,(ulong)local_60.n,8,greedycmp);
    __ptr = local_60.v;
  }
  uVar9 = 0;
LAB_001277ce:
  uVar9 = uVar9 & 0xffffffff;
  do {
    iVar8 = 0;
    if ((pvx.n <= uVar10) || (local_60.n <= (uint)uVar9)) goto LAB_00127843;
    pPVar4 = pvx.v[uVar10];
    pPVar5 = __ptr[uVar9];
    if (pPVar4 == pPVar5) goto LAB_00127834;
    pcVar6 = (pPVar5->parse_node).start_loc.s;
    pcVar7 = (pPVar4->parse_node).start_loc.s;
    if (pcVar7 < pcVar6) goto LAB_00127837;
    if (pcVar7 <= pcVar6) {
      iVar8 = (pPVar5->parse_node).symbol;
      iVar1 = (pPVar4->parse_node).symbol;
      if (iVar1 < iVar8) goto LAB_00127837;
      if (iVar1 <= iVar8) break;
    }
    uVar9 = uVar9 + 1;
  } while( true );
  pcVar6 = (pPVar5->parse_node).end;
  pcVar7 = (pPVar4->parse_node).end;
  if (pcVar7 <= pcVar6) {
    if (pcVar7 < pcVar6) {
LAB_00127840:
      iVar8 = 1;
LAB_00127843:
      if (pvx.v != pvx.e && pvx.v != (PNode **)0x0) {
        free(pvx.v);
        __ptr = local_60.v;
      }
      pvx.n = 0;
      pvx.v = (PNode **)0x0;
      if (__ptr != local_60.e && __ptr != (PNode **)0x0) {
        free(__ptr);
      }
      return iVar8;
    }
    uVar2 = (pPVar5->children).n;
    uVar3 = (pPVar4->children).n;
    if (uVar2 <= uVar3) {
      if (uVar2 < uVar3) goto LAB_00127840;
LAB_00127834:
      uVar9 = (ulong)((uint)uVar9 + 1);
LAB_00127837:
      uVar10 = uVar10 + 1;
      goto LAB_001277ce;
    }
  }
  iVar8 = -1;
  goto LAB_00127843;
}

Assistant:

static int cmp_greediness(Parser *p, PNode *x, PNode *y) {
  uint ix = 0, iy = 0;
  int ret = 0;

  VecPNode pvx, pvy;
  vec_clear(&pvx);
  vec_clear(&pvy);
  get_unshared_pnodes(p, x, y, &pvx, &pvy);
  if (pvx.v != NULL) qsort(pvx.v, pvx.n, sizeof(PNode *), greedycmp);
  if (pvy.v != NULL) qsort(pvy.v, pvy.n, sizeof(PNode *), greedycmp);
  while (1) {
    if (pvx.n <= ix || pvy.n <= iy) RET(0);
    x = pvx.v[ix];
    y = pvy.v[iy];
    if (x == y) {
      ix++;
      iy++;
    } else if (x->parse_node.start_loc.s < y->parse_node.start_loc.s)
      ix++;
    else if (x->parse_node.start_loc.s > y->parse_node.start_loc.s)
      iy++;
    else if (x->parse_node.symbol < y->parse_node.symbol)
      ix++;
    else if (x->parse_node.symbol > y->parse_node.symbol)
      iy++;
    else if (x->parse_node.end > y->parse_node.end)
      RET(-1);
    else if (x->parse_node.end < y->parse_node.end)
      RET(1);
    else if (x->children.n < y->children.n)
      RET(-1);
    else if (x->children.n > y->children.n)
      RET(1);
    else {
      ix++;
      iy++;
    }
  }
Lreturn:
  vec_free(&pvx);
  vec_free(&pvy);
  return ret;
}